

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O1

Reals __thiscall
Omega_h::clamp_metrics(Omega_h *this,LO nmetrics,Reals *metrics,Real h_min,Real h_max)

{
  int *piVar1;
  Int IVar2;
  void *pvVar3;
  void *extraout_RDX;
  Alloc *pAVar4;
  Reals RVar5;
  Reals local_68;
  Reals local_58;
  Reals local_48;
  Reals local_38;
  
  local_38.write_.shared_alloc_.alloc = (metrics->write_).shared_alloc_.alloc;
  if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
      local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_38.write_.shared_alloc_.alloc =
           (Alloc *)((local_38.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_38.write_.shared_alloc_.alloc)->use_count =
           (local_38.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_38.write_.shared_alloc_.direct_ptr = (metrics->write_).shared_alloc_.direct_ptr;
  IVar2 = get_metrics_dim(nmetrics,&local_38);
  pAVar4 = local_38.write_.shared_alloc_.alloc;
  if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
      local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_38.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  if (IVar2 == 1) {
    local_68.write_.shared_alloc_.alloc = (metrics->write_).shared_alloc_.alloc;
    if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.write_.shared_alloc_.alloc)->use_count =
             (local_68.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.write_.shared_alloc_.direct_ptr = (metrics->write_).shared_alloc_.direct_ptr;
    RVar5 = clamp_metrics_dim<1>(this,nmetrics,&local_68,h_min,h_max);
    pvVar3 = RVar5.write_.shared_alloc_.direct_ptr;
    pAVar4 = local_68.write_.shared_alloc_.alloc;
  }
  else if (IVar2 == 2) {
    local_58.write_.shared_alloc_.alloc = (metrics->write_).shared_alloc_.alloc;
    if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
        local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_58.write_.shared_alloc_.alloc =
             (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_58.write_.shared_alloc_.alloc)->use_count =
             (local_58.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_58.write_.shared_alloc_.direct_ptr = (metrics->write_).shared_alloc_.direct_ptr;
    RVar5 = clamp_metrics_dim<2>(this,nmetrics,&local_58,h_min,h_max);
    pvVar3 = RVar5.write_.shared_alloc_.direct_ptr;
    pAVar4 = local_58.write_.shared_alloc_.alloc;
  }
  else {
    if (IVar2 != 3) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric.cpp"
           ,0x35);
    }
    local_48.write_.shared_alloc_.alloc = (metrics->write_).shared_alloc_.alloc;
    if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
        local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_48.write_.shared_alloc_.alloc =
             (Alloc *)((local_48.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_48.write_.shared_alloc_.alloc)->use_count =
             (local_48.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_48.write_.shared_alloc_.direct_ptr = (metrics->write_).shared_alloc_.direct_ptr;
    RVar5 = clamp_metrics_dim<3>(this,nmetrics,&local_48,h_min,h_max);
    pvVar3 = RVar5.write_.shared_alloc_.direct_ptr;
    pAVar4 = local_48.write_.shared_alloc_.alloc;
  }
  if (((ulong)pAVar4 & 7) == 0 && pAVar4 != (Alloc *)0x0) {
    piVar1 = &pAVar4->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar4);
      operator_delete(pAVar4,0x48);
      pvVar3 = extraout_RDX;
    }
  }
  RVar5.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar5.write_.shared_alloc_;
}

Assistant:

Reals clamp_metrics(LO nmetrics, Reals metrics, Real h_min, Real h_max) {
  auto dim = get_metrics_dim(nmetrics, metrics);
  if (dim == 3) return clamp_metrics_dim<3>(nmetrics, metrics, h_min, h_max);
  if (dim == 2) return clamp_metrics_dim<2>(nmetrics, metrics, h_min, h_max);
  if (dim == 1) return clamp_metrics_dim<1>(nmetrics, metrics, h_min, h_max);
  OMEGA_H_NORETURN(Reals());
}